

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O1

void google::protobuf::DynamicMessageFactory::ConstructDefaultOneofInstance
               (Descriptor *type,uint32 *offsets,void *default_oneof_or_weak_instance)

{
  FieldDescriptor *this;
  undefined4 uVar1;
  long lVar2;
  long *plVar3;
  EnumValueDescriptor *pEVar4;
  undefined8 uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  
  if (0 < *(int *)(type + 0x6c)) {
    lVar6 = 0;
    do {
      lVar2 = *(long *)(type + 0x30);
      lVar9 = lVar6 * 0x30;
      if (0 < *(int *)(lVar2 + 0x18 + lVar9)) {
        lVar8 = 0;
        do {
          this = *(FieldDescriptor **)(*(long *)(lVar2 + 0x20 + lVar9) + lVar8 * 8);
          if (this[0x42] == (FieldDescriptor)0x0) {
            plVar3 = (long *)(*(long *)(this + 0x50) + 0x28);
          }
          else if (*(long *)(this + 0x60) == 0) {
            plVar3 = (long *)(*(long *)(this + 0x28) + 0x80);
          }
          else {
            plVar3 = (long *)(*(long *)(this + 0x60) + 0x50);
          }
          uVar7 = (ulong)offsets[(int)((ulong)((long)this - *plVar3) >> 3) * 0x286bca1b];
          if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
            local_38 = FieldDescriptor::TypeOnceInit;
            local_40 = this;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (*(once_flag **)(this + 0x30),&local_38,&local_40);
          }
          switch(*(undefined4 *)
                  (FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(this + 0x38) * 4)) {
          case 1:
          case 3:
            uVar1 = *(undefined4 *)(this + 0x90);
            goto LAB_00311afa;
          case 2:
          case 4:
            uVar5 = *(undefined8 *)(this + 0x90);
            goto LAB_00311b3c;
          case 5:
            *(undefined8 *)((long)default_oneof_or_weak_instance + uVar7) =
                 *(undefined8 *)(this + 0x90);
            break;
          case 6:
            *(undefined4 *)((long)default_oneof_or_weak_instance + uVar7) =
                 *(undefined4 *)(this + 0x90);
            break;
          case 7:
            *(FieldDescriptor *)((long)default_oneof_or_weak_instance + uVar7) = this[0x90];
            break;
          case 8:
            pEVar4 = FieldDescriptor::default_value_enum(this);
            uVar1 = *(undefined4 *)(pEVar4 + 0x10);
LAB_00311afa:
            *(undefined4 *)((long)default_oneof_or_weak_instance + uVar7) = uVar1;
            break;
          case 9:
            *(undefined8 *)((long)default_oneof_or_weak_instance + uVar7) = 0;
            uVar5 = *(undefined8 *)(this + 0x90);
LAB_00311b3c:
            *(undefined8 *)((long)default_oneof_or_weak_instance + uVar7) = uVar5;
            break;
          case 10:
            *(undefined8 *)((long)default_oneof_or_weak_instance + uVar7) = 0;
          }
          lVar8 = lVar8 + 1;
          lVar2 = *(long *)(type + 0x30);
        } while (lVar8 < *(int *)(lVar2 + 0x18 + lVar9));
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < *(int *)(type + 0x6c));
  }
  return;
}

Assistant:

void DynamicMessageFactory::ConstructDefaultOneofInstance(
    const Descriptor* type, const uint32 offsets[],
    void* default_oneof_or_weak_instance) {
  for (int i = 0; i < type->oneof_decl_count(); i++) {
    for (int j = 0; j < type->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = type->oneof_decl(i)->field(j);
      void* field_ptr =
          reinterpret_cast<uint8*>(default_oneof_or_weak_instance) +
          offsets[field->index()];
      switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                       \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:               \
    new (field_ptr) TYPE(field->default_value_##TYPE()); \
    break;

        HANDLE_TYPE(INT32, int32);
        HANDLE_TYPE(INT64, int64);
        HANDLE_TYPE(UINT32, uint32);
        HANDLE_TYPE(UINT64, uint64);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE(FLOAT, float);
        HANDLE_TYPE(BOOL, bool);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_ENUM:
          new (field_ptr) int(field->default_value_enum()->number());
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->options().ctype()) {
            default:
            case FieldOptions::STRING:
              ArenaStringPtr* asp = new (field_ptr) ArenaStringPtr();
              asp->UnsafeSetDefault(&field->default_value_string());
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE: {
          new (field_ptr) Message*(NULL);
          break;
        }
      }
    }
  }
}